

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event.cpp
# Opt level: O2

void __thiscall cppnet::TimerEvent::OnTimer(TimerEvent *this)

{
  ushort uVar1;
  SingletonLogger *this_00;
  shared_ptr<cppnet::RWSocket> rw_sock;
  shared_ptr<cppnet::Socket> sock;
  
  uVar1 = (this->super_Event)._event_type;
  if ((uVar1 & 0x10) != 0) {
    std::function<void_(void_*)>::operator()(&this->_timer_cb,(this->super_Event)._data);
    return;
  }
  if ((uVar1 & 8) == 0) {
    this_00 = Singleton<cppnet::SingletonLogger>::Instance();
    SingletonLogger::Error
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/timer_event.cpp"
               ,0x1b,"invalid timer type. type:%d",(ulong)(this->super_Event)._event_type);
    return;
  }
  std::__shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>,
             &(this->super_Event)._socket);
  std::dynamic_pointer_cast<cppnet::RWSocket,cppnet::Socket>((shared_ptr<cppnet::Socket> *)&rw_sock)
  ;
  (*((rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Socket
    )._vptr_Socket[0xd])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void TimerEvent::OnTimer() {
    if (GetType() & ET_USER_TIMER) {
        _timer_cb(GetData());

    } else if (GetType() & ET_TIMER) {
        auto sock = GetSocket();
        auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
        rw_sock->OnTimer();

    } else {
        LOG_ERROR("invalid timer type. type:%d", GetType());
    }
}